

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzDD::NodeIntStateScatter(ChNodeFEAxyzDD *this)

{
  uint in_ECX;
  ChState *in_RDX;
  uint in_ESI;
  ChStateDelta *in_R8;
  double in_XMM0_Qa;
  
  NodeIntStateScatter((ChNodeFEAxyzDD *)
                      ((long)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                              _vptr_ChNodeFEAbase +
                      (long)(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.
                            _vptr_ChNodeFEAbase[-7]),in_ESI,in_RDX,in_ECX,in_R8,in_XMM0_Qa);
  return;
}

Assistant:

void ChNodeFEAxyzDD::NodeIntStateScatter(const unsigned int off_x,
                                         const ChState& x,
                                         const unsigned int off_v,
                                         const ChStateDelta& v,
                                         const double T) {
    SetPos(x.segment(off_x, 3));
    SetD(x.segment(off_x + 3, 3));
    SetDD(x.segment(off_x + 6, 3));

    SetPos_dt(v.segment(off_v, 3));
    SetD_dt(v.segment(off_v + 3, 3));
    SetDD_dt(v.segment(off_v + 6, 3));
}